

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void tcg_gen_vec_sar8i_i64_sparc64(TCGContext_conflict8 *tcg_ctx,TCGv_i64 d,TCGv_i64 a,int64_t c)

{
  byte bVar1;
  TCGv_i64 ret;
  TCGv_i64 s;
  uint64_t c_mask;
  uint64_t s_mask;
  int64_t c_local;
  TCGv_i64 a_local;
  TCGv_i64 d_local;
  TCGContext_conflict8 *tcg_ctx_local;
  
  bVar1 = (byte)c;
  ret = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_shri_i64_sparc64(tcg_ctx,d,a,c);
  tcg_gen_andi_i64_sparc64(tcg_ctx,ret,d,(ulong)(0x80 >> (bVar1 & 0x1f) & 0xff) * 0x101010101010101)
  ;
  tcg_gen_muli_i64_sparc64(tcg_ctx,ret,ret,(long)((2 << (bVar1 & 0x1f)) + -2));
  tcg_gen_andi_i64_sparc64(tcg_ctx,d,d,(ulong)(0xff >> (bVar1 & 0x1f) & 0xff) * 0x101010101010101);
  tcg_gen_or_i64_sparc64(tcg_ctx,d,d,ret);
  tcg_temp_free_i64(tcg_ctx,ret);
  return;
}

Assistant:

void tcg_gen_vec_sar8i_i64(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 a, int64_t c)
{
    uint64_t s_mask = dup_const(MO_8, 0x80 >> c);
    uint64_t c_mask = dup_const(MO_8, 0xff >> c);
    TCGv_i64 s = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_shri_i64(tcg_ctx, d, a, c);
    tcg_gen_andi_i64(tcg_ctx, s, d, s_mask);  /* isolate (shifted) sign bit */
    tcg_gen_muli_i64(tcg_ctx, s, s, (2 << c) - 2); /* replicate isolated signs */
    tcg_gen_andi_i64(tcg_ctx, d, d, c_mask);  /* clear out bits above sign  */
    tcg_gen_or_i64(tcg_ctx, d, d, s);         /* include sign extension */
    tcg_temp_free_i64(tcg_ctx, s);
}